

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_utils.cpp
# Opt level: O3

bool FileSysUtilsGetCanonicalPath(string *path,string *canonical)

{
  char *pcVar1;
  char *pcVar2;
  char buf [4096];
  char acStack_1028 [4104];
  
  pcVar2 = realpath((path->_M_dataplus)._M_p,acStack_1028);
  if (pcVar2 != (char *)0x0) {
    pcVar1 = (char *)canonical->_M_string_length;
    strlen(acStack_1028);
    std::__cxx11::string::_M_replace((ulong)canonical,0,pcVar1,(ulong)acStack_1028);
  }
  return pcVar2 != (char *)0x0;
}

Assistant:

bool FileSysUtilsGetCanonicalPath(const std::string& path, std::string& canonical) {
    char buf[PATH_MAX];
    if (nullptr != realpath(path.c_str(), buf)) {
        canonical = buf;
        return true;
    }
    return false;
}